

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
::load(list_caster<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
       *this,handle src,bool convert)

{
  byte bVar1;
  bool bVar2;
  template_cast_op_type<typename_std::add_rvalue_reference<vector<double>_&&>::type> __x;
  sequence_iterator sVar3;
  sequence_slow_readwrite sVar4;
  handle local_d0;
  PyObject *local_c8;
  undefined1 local_c0 [8];
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence local_50;
  PyObject *local_48;
  sequence local_40;
  sequence s;
  bool convert_local;
  list_caster<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
  *this_local;
  handle src_local;
  
  bVar2 = isinstance<pybind11::sequence,_0>(src);
  if ((!bVar2) ||
     (s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr,
     bVar2 = isinstance<pybind11::str,_0>(src), bVar2)) {
    src_local.m_ptr._7_1_ = 0;
  }
  else {
    local_48 = src.m_ptr;
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_40,src);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::clear(&this->value);
    sequence::sequence(&local_50,&local_40);
    reserve_maybe<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_0>
              (this,&local_50,&this->value);
    sequence::~sequence(&local_50);
    sVar3 = sequence::begin(&local_40);
    __end3.super_sequence_slow_readwrite.index =
         (ssize_t)sVar3.super_sequence_slow_readwrite.obj.m_ptr;
    sVar4 = (sequence_slow_readwrite)sequence::end(&local_40);
    while( true ) {
      __end3.super_sequence_slow_readwrite.obj.m_ptr = (PyObject *)sVar4.index;
      it.cache.super_handle.m_ptr = sVar4.obj.m_ptr;
      bVar2 = detail::operator!=((It *)&__end3.super_sequence_slow_readwrite.index,(It *)&it.cache);
      if (!bVar2) break;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((reference *)
                 &conv.super_list_caster<std::vector<double,_std::allocator<double>_>,_double>.value
                  .super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      type_caster<std::vector<double,_std::allocator<double>_>,_void>::type_caster
                ((type_caster<std::vector<double,_std::allocator<double>_>,_void> *)local_c0);
      accessor::operator_cast_to_object((accessor *)&local_d0);
      local_c8 = local_d0.m_ptr;
      bVar2 = list_caster<std::vector<double,_std::allocator<double>_>,_double>::load
                        ((list_caster<std::vector<double,_std::allocator<double>_>,_double> *)
                         local_c0,local_d0,convert);
      object::~object((object *)&local_d0);
      bVar1 = (bVar2 ^ 0xffU) & 1;
      if (bVar1 == 0) {
        __x = cast_op<std::vector<double,std::allocator<double>>&&>
                        ((make_caster<std::vector<double>_&&> *)local_c0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&this->value,__x);
      }
      else {
        src_local.m_ptr._7_1_ = 0;
      }
      type_caster<std::vector<double,_std::allocator<double>_>,_void>::~type_caster
                ((type_caster<std::vector<double,_std::allocator<double>_>,_void> *)local_c0);
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 &conv.super_list_caster<std::vector<double,_std::allocator<double>_>,_double>.value
                  .super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (bVar1 != 0) goto LAB_00139c99;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      sVar4.index = (ssize_t)__end3.super_sequence_slow_readwrite.obj.m_ptr;
      sVar4.obj = it.cache.super_handle.m_ptr;
    }
    src_local.m_ptr._7_1_ = 1;
LAB_00139c99:
    sequence::~sequence(&local_40);
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }